

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  float *pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  _func_int **pp_Var20;
  ulong *puVar21;
  undefined4 uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  NodeRef nodeRef;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar32 [64];
  vint4 ai;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  vint4 ai_1;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 ai_3;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 bi_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vint4 bi_3;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  vint4 ai_2;
  undefined1 auVar57 [16];
  vint4 bi_2;
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  vint<4> mask;
  vint4 bi_8;
  vint<4> octant;
  vfloat<8> fmin;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  AccelData *local_26b8;
  ulong local_26b0;
  RayHitK<4> *local_26a8;
  RayQueryContext *local_26a0;
  ulong local_2698;
  long local_2690;
  long local_2688;
  ulong local_2680;
  ulong local_2678;
  undefined1 local_2670 [16];
  RTCIntersectFunctionNArguments local_2660;
  Geometry *local_2630;
  undefined8 local_2628;
  RTCIntersectArguments *local_2620;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [8];
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  undefined4 uStack_24e4;
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [8];
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  undefined4 uStack_24a4;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [8];
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined4 uStack_2464;
  undefined1 local_2460 [32];
  undefined1 local_2440 [8];
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  undefined4 uStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [8];
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined4 uStack_23e4;
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [8];
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  undefined4 uStack_23a4;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  auVar28 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar29 = vpcmpeqd_avx(auVar28,(undefined1  [16])valid_i->field_0);
  uVar16 = vmovmskps_avx(auVar29);
  if (uVar16 == 0) {
    return;
  }
  local_26b8 = This->ptr;
  local_26b0 = (ulong)(uVar16 & 0xff);
  auVar61 = ZEXT1664(*(undefined1 (*) [16])ray);
  auVar62 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
  auVar63 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
  auVar33 = *(undefined1 (*) [16])(ray + 0x40);
  auVar39._8_4_ = 0x7fffffff;
  auVar39._0_8_ = 0x7fffffff7fffffff;
  auVar39._12_4_ = 0x7fffffff;
  auVar37 = vandps_avx(auVar33,auVar39);
  auVar50._8_4_ = 0x219392ef;
  auVar50._0_8_ = 0x219392ef219392ef;
  auVar50._12_4_ = 0x219392ef;
  auVar37 = vcmpps_avx(auVar37,auVar50,1);
  auVar41 = vblendvps_avx(auVar33,auVar50,auVar37);
  auVar37 = *(undefined1 (*) [16])(ray + 0x50);
  auVar47 = vandps_avx(auVar37,auVar39);
  auVar47 = vcmpps_avx(auVar47,auVar50,1);
  auVar40 = vblendvps_avx(auVar37,auVar50,auVar47);
  auVar47 = *(undefined1 (*) [16])(ray + 0x60);
  auVar39 = vandps_avx(auVar47,auVar39);
  auVar39 = vcmpps_avx(auVar39,auVar50,1);
  auVar39 = vblendvps_avx(auVar47,auVar50,auVar39);
  auVar46 = vrcpps_avx(auVar41);
  fVar6 = auVar46._0_4_;
  auVar45._0_4_ = auVar41._0_4_ * fVar6;
  fVar7 = auVar46._4_4_;
  auVar45._4_4_ = auVar41._4_4_ * fVar7;
  fVar8 = auVar46._8_4_;
  auVar45._8_4_ = auVar41._8_4_ * fVar8;
  fVar9 = auVar46._12_4_;
  auVar45._12_4_ = auVar41._12_4_ * fVar9;
  auVar59._8_4_ = 0x3f800000;
  auVar59._0_8_ = 0x3f8000003f800000;
  auVar59._12_4_ = 0x3f800000;
  auVar41 = vsubps_avx(auVar59,auVar45);
  local_25a0._0_4_ = fVar6 + fVar6 * auVar41._0_4_;
  local_25a0._4_4_ = fVar7 + fVar7 * auVar41._4_4_;
  local_25a0._8_4_ = fVar8 + fVar8 * auVar41._8_4_;
  local_25a0._12_4_ = fVar9 + fVar9 * auVar41._12_4_;
  auVar64 = ZEXT1664(local_25a0);
  auVar41 = vrcpps_avx(auVar40);
  fVar6 = auVar41._0_4_;
  auVar51._0_4_ = auVar40._0_4_ * fVar6;
  fVar7 = auVar41._4_4_;
  auVar51._4_4_ = auVar40._4_4_ * fVar7;
  fVar8 = auVar41._8_4_;
  auVar51._8_4_ = auVar40._8_4_ * fVar8;
  fVar9 = auVar41._12_4_;
  auVar51._12_4_ = auVar40._12_4_ * fVar9;
  auVar41 = vsubps_avx(auVar59,auVar51);
  local_25b0._0_4_ = fVar6 + fVar6 * auVar41._0_4_;
  local_25b0._4_4_ = fVar7 + fVar7 * auVar41._4_4_;
  local_25b0._8_4_ = fVar8 + fVar8 * auVar41._8_4_;
  local_25b0._12_4_ = fVar9 + fVar9 * auVar41._12_4_;
  auVar65 = ZEXT1664(local_25b0);
  auVar41 = vrcpps_avx(auVar39);
  fVar6 = auVar41._0_4_;
  auVar40._0_4_ = auVar39._0_4_ * fVar6;
  fVar7 = auVar41._4_4_;
  auVar40._4_4_ = auVar39._4_4_ * fVar7;
  fVar8 = auVar41._8_4_;
  auVar40._8_4_ = auVar39._8_4_ * fVar8;
  fVar9 = auVar41._12_4_;
  auVar40._12_4_ = auVar39._12_4_ * fVar9;
  auVar39 = vsubps_avx(auVar59,auVar40);
  local_25c0._0_4_ = fVar6 + fVar6 * auVar39._0_4_;
  local_25c0._4_4_ = fVar7 + fVar7 * auVar39._4_4_;
  local_25c0._8_4_ = fVar8 + fVar8 * auVar39._8_4_;
  local_25c0._12_4_ = fVar9 + fVar9 * auVar39._12_4_;
  auVar60 = ZEXT1664(local_25c0);
  auVar39 = ZEXT416(0) << 0x20;
  local_25d0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar39);
  local_25e0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar39);
  auVar33 = vcmpps_avx(auVar33,auVar39,1);
  auVar41._8_4_ = 1;
  auVar41._0_8_ = 0x100000001;
  auVar41._12_4_ = 1;
  auVar33 = vandps_avx(auVar33,auVar41);
  auVar37 = vcmpps_avx(auVar37,auVar39,1);
  auVar46._8_4_ = 2;
  auVar46._0_8_ = 0x200000002;
  auVar46._12_4_ = 2;
  auVar37 = vandps_avx(auVar37,auVar46);
  auVar37 = vorps_avx(auVar37,auVar33);
  auVar33 = vcmpps_avx(auVar47,auVar39,1);
  auVar47._8_4_ = 4;
  auVar47._0_8_ = 0x400000004;
  auVar47._12_4_ = 4;
  auVar33 = vandps_avx(auVar33,auVar47);
  auVar28 = vpor_avx(auVar29 ^ auVar28,auVar33);
  local_2670 = vpor_avx(auVar28,auVar37);
  auVar58 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  local_2570 = *(undefined1 (*) [16])ray;
  local_2580 = *(undefined1 (*) [16])(ray + 0x10);
  local_2590 = *(undefined1 (*) [16])(ray + 0x20);
  local_26a8 = ray;
  local_26a0 = context;
LAB_0100a69e:
  lVar5 = 0;
  if (local_26b0 != 0) {
    for (; (local_26b0 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  uVar22 = *(undefined4 *)(local_2670 + lVar5 * 4);
  auVar28._4_4_ = uVar22;
  auVar28._0_4_ = uVar22;
  auVar28._8_4_ = uVar22;
  auVar28._12_4_ = uVar22;
  auVar37 = vpcmpeqd_avx(auVar28,local_2670);
  uVar22 = vmovmskps_avx(auVar37);
  local_26b0 = ~CONCAT44((int)((ulong)lVar5 >> 0x20),uVar22) & local_26b0;
  auVar40 = auVar58._0_16_;
  auVar28 = vblendvps_avx(auVar40,auVar61._0_16_,auVar37);
  auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar29 = vminps_avx(auVar29,auVar28);
  auVar33 = vshufpd_avx(auVar29,auVar29,1);
  auVar28 = vblendvps_avx(auVar40,auVar62._0_16_,auVar37);
  auVar29 = vminps_avx(auVar33,auVar29);
  auVar33 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar33,auVar28);
  auVar33 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vminps_avx(auVar33,auVar28);
  auVar29 = vinsertps_avx(auVar29,auVar28,0x1c);
  auVar28 = vblendvps_avx(auVar40,auVar63._0_16_,auVar37);
  auVar33 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar33,auVar28);
  auVar33 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vminps_avx(auVar33,auVar28);
  auVar33 = vinsertps_avx(auVar29,auVar28,0x20);
  auVar57._8_4_ = 0xff800000;
  auVar57._0_8_ = 0xff800000ff800000;
  auVar57._12_4_ = 0xff800000;
  auVar28 = vblendvps_avx(auVar57,auVar61._0_16_,auVar37);
  auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar29 = vmaxps_avx(auVar29,auVar28);
  auVar47 = vshufpd_avx(auVar29,auVar29,1);
  auVar28 = vblendvps_avx(auVar57,auVar62._0_16_,auVar37);
  auVar29 = vmaxps_avx(auVar47,auVar29);
  auVar47 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar47,auVar28);
  auVar47 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vmaxps_avx(auVar47,auVar28);
  auVar29 = vinsertps_avx(auVar29,auVar28,0x1c);
  auVar28 = vblendvps_avx(auVar57,auVar63._0_16_,auVar37);
  auVar47 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar47,auVar28);
  auVar47 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vmaxps_avx(auVar47,auVar28);
  auVar47 = vinsertps_avx(auVar29,auVar28,0x20);
  auVar28 = vblendvps_avx(auVar40,auVar64._0_16_,auVar37);
  auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar29 = vminps_avx(auVar29,auVar28);
  auVar39 = vshufpd_avx(auVar29,auVar29,1);
  auVar28 = vblendvps_avx(auVar40,auVar65._0_16_,auVar37);
  auVar29 = vminps_avx(auVar39,auVar29);
  auVar39 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar39,auVar28);
  auVar39 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vminps_avx(auVar39,auVar28);
  auVar29 = vinsertps_avx(auVar29,auVar28,0x1c);
  auVar28 = vblendvps_avx(auVar40,auVar60._0_16_,auVar37);
  auVar39 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar39,auVar28);
  auVar39 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vminps_avx(auVar39,auVar28);
  auVar39 = vinsertps_avx(auVar29,auVar28,0x20);
  auVar28 = vblendvps_avx(auVar57,auVar64._0_16_,auVar37);
  auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar29 = vmaxps_avx(auVar29,auVar28);
  auVar41 = vshufpd_avx(auVar29,auVar29,1);
  auVar28 = vblendvps_avx(auVar57,auVar65._0_16_,auVar37);
  auVar29 = vmaxps_avx(auVar41,auVar29);
  auVar41 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar41,auVar28);
  auVar41 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vmaxps_avx(auVar41,auVar28);
  auVar29 = vinsertps_avx(auVar29,auVar28,0x1c);
  auVar28 = vblendvps_avx(auVar57,auVar60._0_16_,auVar37);
  auVar41 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar41,auVar28);
  auVar41 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vmaxps_avx(auVar41,auVar28);
  auVar41 = vinsertps_avx(auVar29,auVar28,0x20);
  local_2550 = vblendvps_avx(auVar40,local_25d0,auVar37);
  auVar28 = vshufps_avx(local_2550,local_2550,0xb1);
  auVar46 = vminps_avx(auVar28,local_2550);
  local_26d0 = vblendvps_avx(auVar57,local_25e0,auVar37);
  auVar28 = vshufps_avx(local_26d0,local_26d0,0xb1);
  auVar40 = vmaxps_avx(auVar28,local_26d0);
  auVar37 = vcmpps_avx(auVar39,_DAT_01f45a50,5);
  auVar28 = vblendvps_avx(auVar41,auVar39,auVar37);
  auVar29 = vblendvps_avx(auVar33,auVar47,auVar37);
  auVar33 = vblendvps_avx(auVar47,auVar33,auVar37);
  auVar45 = vshufpd_avx(auVar40,auVar40,1);
  auVar47 = vmovshdup_avx(auVar28);
  local_2678 = (ulong)(auVar47._0_4_ < 0.0) << 5 | 0x40;
  auVar47 = vshufpd_avx(auVar28,auVar28,1);
  auVar58 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  uVar27 = (ulong)(auVar47._0_4_ < 0.0) << 5 | 0x80;
  local_2680 = local_2678 ^ 0x20;
  auVar47 = vmaxss_avx(auVar45,auVar40);
  auVar37 = vblendvps_avx(auVar39,auVar41,auVar37);
  auVar54._0_4_ = auVar29._0_4_ * auVar28._0_4_;
  auVar54._4_4_ = auVar29._4_4_ * auVar28._4_4_;
  auVar54._8_4_ = auVar29._8_4_ * auVar28._8_4_;
  auVar54._12_4_ = auVar29._12_4_ * auVar28._12_4_;
  auVar42._0_4_ = auVar33._0_4_ * auVar37._0_4_;
  auVar42._4_4_ = auVar33._4_4_ * auVar37._4_4_;
  auVar42._8_4_ = auVar33._8_4_ * auVar37._8_4_;
  auVar42._12_4_ = auVar33._12_4_ * auVar37._12_4_;
  uVar25 = (ulong)(auVar28._0_4_ < 0.0) << 5;
  uVar26 = uVar25 ^ 0x20;
  local_23a0 = *(ulong *)&local_26b8[1].bounds.bounds0.lower.field_0;
  local_2398[0] = 0;
  auVar29 = vshufps_avx(auVar28,auVar28,0);
  register0x00001210 = auVar29;
  _local_23c0 = auVar29;
  auVar29 = vshufps_avx(auVar54,auVar54,0);
  local_23e0._16_16_ = auVar29;
  local_23e0._0_16_ = auVar29;
  auVar29 = vshufps_avx(auVar28,auVar28,0x55);
  register0x00001210 = auVar29;
  _local_2400 = auVar29;
  auVar29 = vshufps_avx(auVar54,auVar54,0x55);
  local_2420._16_16_ = auVar29;
  local_2420._0_16_ = auVar29;
  auVar28 = vshufps_avx(auVar28,auVar28,0xaa);
  register0x00001210 = auVar28;
  _local_2440 = auVar28;
  auVar28 = vshufps_avx(auVar54,auVar54,0xaa);
  local_2460._16_16_ = auVar28;
  local_2460._0_16_ = auVar28;
  auVar28 = vshufps_avx(auVar37,auVar37,0);
  register0x00001210 = auVar28;
  _local_2480 = auVar28;
  auVar28 = vshufps_avx(auVar42,auVar42,0);
  local_24a0._16_16_ = auVar28;
  local_24a0._0_16_ = auVar28;
  auVar28 = vshufps_avx(auVar37,auVar37,0x55);
  register0x00001210 = auVar28;
  _local_24c0 = auVar28;
  auVar28 = vshufps_avx(auVar46,auVar46,0);
  auVar29 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar28 = vminps_avx(auVar29,auVar28);
  auVar29 = vshufps_avx(auVar42,auVar42,0x55);
  local_24e0._16_16_ = auVar29;
  local_24e0._0_16_ = auVar29;
  auVar29 = vshufps_avx(auVar37,auVar37,0xaa);
  register0x00001290 = auVar29;
  _local_2500 = auVar29;
  auVar29 = vshufps_avx(auVar42,auVar42,0xaa);
  local_2520._16_16_ = auVar29;
  local_2520._0_16_ = auVar29;
  local_2540._16_16_ = auVar28;
  local_2540._0_16_ = auVar28;
  puVar21 = local_2390;
  local_2698 = uVar25;
  do {
    auVar28 = vshufps_avx(auVar47,auVar47,0);
    local_2600._16_16_ = auVar28;
    local_2600._0_16_ = auVar28;
LAB_0100aa45:
    do {
      do {
        do {
          if (puVar21 == &local_23a0) {
            if (local_26b0 == 0) {
              return;
            }
            goto LAB_0100a69e;
          }
          uVar22 = (undefined4)puVar21[-1];
          auVar29._4_4_ = uVar22;
          auVar29._0_4_ = uVar22;
          auVar29._8_4_ = uVar22;
          auVar29._12_4_ = uVar22;
          auVar32 = ZEXT1664(auVar29);
          puVar21 = puVar21 + -2;
          auVar28 = vcmpps_avx(auVar29,local_26d0,1);
        } while ((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                  (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 -1 < auVar28[0xf]);
        uVar17 = *puVar21;
        while ((uVar17 & 8) == 0) {
          pfVar4 = (float *)(uVar17 + 0x40 + uVar25);
          auVar10._4_4_ = (float)local_23c0._4_4_ * pfVar4[1];
          auVar10._0_4_ = (float)local_23c0._0_4_ * *pfVar4;
          auVar10._8_4_ = fStack_23b8 * pfVar4[2];
          auVar10._12_4_ = fStack_23b4 * pfVar4[3];
          auVar10._16_4_ = fStack_23b0 * pfVar4[4];
          auVar10._20_4_ = fStack_23ac * pfVar4[5];
          auVar10._24_4_ = fStack_23a8 * pfVar4[6];
          auVar10._28_4_ = uStack_23a4;
          pfVar4 = (float *)(uVar17 + 0x40 + local_2678);
          auVar11._4_4_ = (float)local_2400._4_4_ * pfVar4[1];
          auVar11._0_4_ = (float)local_2400._0_4_ * *pfVar4;
          auVar11._8_4_ = fStack_23f8 * pfVar4[2];
          auVar11._12_4_ = fStack_23f4 * pfVar4[3];
          auVar11._16_4_ = fStack_23f0 * pfVar4[4];
          auVar11._20_4_ = fStack_23ec * pfVar4[5];
          auVar11._24_4_ = fStack_23e8 * pfVar4[6];
          auVar11._28_4_ = uStack_23e4;
          auVar10 = vsubps_avx(auVar10,local_23e0);
          auVar11 = vsubps_avx(auVar11,local_2420);
          pfVar4 = (float *)(uVar17 + 0x40 + uVar27);
          auVar12._4_4_ = (float)local_2440._4_4_ * pfVar4[1];
          auVar12._0_4_ = (float)local_2440._0_4_ * *pfVar4;
          auVar12._8_4_ = fStack_2438 * pfVar4[2];
          auVar12._12_4_ = fStack_2434 * pfVar4[3];
          auVar12._16_4_ = fStack_2430 * pfVar4[4];
          auVar12._20_4_ = fStack_242c * pfVar4[5];
          auVar12._24_4_ = fStack_2428 * pfVar4[6];
          auVar12._28_4_ = uStack_2424;
          auVar12 = vsubps_avx(auVar12,local_2460);
          pfVar4 = (float *)(uVar17 + 0x40 + uVar26);
          auVar13._4_4_ = (float)local_2480._4_4_ * pfVar4[1];
          auVar13._0_4_ = (float)local_2480._0_4_ * *pfVar4;
          auVar13._8_4_ = fStack_2478 * pfVar4[2];
          auVar13._12_4_ = fStack_2474 * pfVar4[3];
          auVar13._16_4_ = fStack_2470 * pfVar4[4];
          auVar13._20_4_ = fStack_246c * pfVar4[5];
          auVar13._24_4_ = fStack_2468 * pfVar4[6];
          auVar13._28_4_ = uStack_2464;
          auVar13 = vsubps_avx(auVar13,local_24a0);
          auVar28 = vpmaxsd_avx(auVar10._0_16_,auVar11._0_16_);
          auVar29 = vpmaxsd_avx(auVar10._16_16_,auVar11._16_16_);
          auVar33 = vpmaxsd_avx(auVar12._0_16_,local_2540._0_16_);
          auVar28 = vpmaxsd_avx(auVar28,auVar33);
          auVar33 = vpmaxsd_avx(auVar12._16_16_,local_2540._16_16_);
          pfVar4 = (float *)(uVar17 + 0x40 + local_2680);
          auVar14._4_4_ = (float)local_24c0._4_4_ * pfVar4[1];
          auVar14._0_4_ = (float)local_24c0._0_4_ * *pfVar4;
          auVar14._8_4_ = fStack_24b8 * pfVar4[2];
          auVar14._12_4_ = fStack_24b4 * pfVar4[3];
          auVar14._16_4_ = fStack_24b0 * pfVar4[4];
          auVar14._20_4_ = fStack_24ac * pfVar4[5];
          auVar14._24_4_ = fStack_24a8 * pfVar4[6];
          auVar14._28_4_ = uStack_24a4;
          auVar10 = vsubps_avx(auVar14,local_24e0);
          auVar29 = vpmaxsd_avx(auVar29,auVar33);
          pfVar4 = (float *)(uVar17 + 0x40 + (uVar27 ^ 0x20));
          auVar15._4_4_ = (float)local_2500._4_4_ * pfVar4[1];
          auVar15._0_4_ = (float)local_2500._0_4_ * *pfVar4;
          auVar15._8_4_ = fStack_24f8 * pfVar4[2];
          auVar15._12_4_ = fStack_24f4 * pfVar4[3];
          auVar15._16_4_ = fStack_24f0 * pfVar4[4];
          auVar15._20_4_ = fStack_24ec * pfVar4[5];
          auVar15._24_4_ = fStack_24e8 * pfVar4[6];
          auVar15._28_4_ = uStack_24e4;
          auVar11 = vsubps_avx(auVar15,local_2520);
          auVar31._16_16_ = auVar29;
          auVar31._0_16_ = auVar28;
          auVar33 = vpminsd_avx(auVar13._0_16_,auVar10._0_16_);
          auVar37 = vpminsd_avx(auVar13._16_16_,auVar10._16_16_);
          auVar47 = vpminsd_avx(auVar11._0_16_,local_2600._0_16_);
          auVar33 = vpminsd_avx(auVar33,auVar47);
          auVar47 = vpminsd_avx(auVar11._16_16_,local_2600._16_16_);
          auVar37 = vpminsd_avx(auVar37,auVar47);
          auVar36._16_16_ = auVar37;
          auVar36._0_16_ = auVar33;
          local_2660.valid = (int *)auVar28._0_8_;
          local_2660.geometryUserPtr = (void *)auVar28._8_8_;
          local_2660.primID = auVar29._0_4_;
          local_2660._20_4_ = auVar29._4_4_;
          local_2660.context = (RTCRayQueryContext *)auVar29._8_8_;
          auVar10 = vcmpps_avx(auVar31,auVar36,2);
          uVar16 = vmovmskps_avx(auVar10);
          if (uVar16 == 0) goto LAB_0100aa45;
          uVar23 = (ulong)(uVar16 & 0xff);
          auVar32 = ZEXT1664(auVar58._0_16_);
          uVar24 = 0;
          uVar18 = 8;
          do {
            lVar5 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            uVar22 = *(undefined4 *)(uVar17 + 0x40 + lVar5 * 4);
            auVar33._4_4_ = uVar22;
            auVar33._0_4_ = uVar22;
            auVar33._8_4_ = uVar22;
            auVar33._12_4_ = uVar22;
            auVar28 = vsubps_avx(auVar33,auVar61._0_16_);
            auVar34._0_4_ = auVar64._0_4_ * auVar28._0_4_;
            auVar34._4_4_ = auVar64._4_4_ * auVar28._4_4_;
            auVar34._8_4_ = auVar64._8_4_ * auVar28._8_4_;
            auVar34._12_4_ = auVar64._12_4_ * auVar28._12_4_;
            uVar22 = *(undefined4 *)(uVar17 + 0x80 + lVar5 * 4);
            auVar37._4_4_ = uVar22;
            auVar37._0_4_ = uVar22;
            auVar37._8_4_ = uVar22;
            auVar37._12_4_ = uVar22;
            auVar28 = vsubps_avx(auVar37,auVar62._0_16_);
            auVar38._0_4_ = auVar65._0_4_ * auVar28._0_4_;
            auVar38._4_4_ = auVar65._4_4_ * auVar28._4_4_;
            auVar38._8_4_ = auVar65._8_4_ * auVar28._8_4_;
            auVar38._12_4_ = auVar65._12_4_ * auVar28._12_4_;
            uVar22 = *(undefined4 *)(uVar17 + 0xc0 + lVar5 * 4);
            auVar43._4_4_ = uVar22;
            auVar43._0_4_ = uVar22;
            auVar43._8_4_ = uVar22;
            auVar43._12_4_ = uVar22;
            auVar28 = vsubps_avx(auVar43,auVar63._0_16_);
            auVar44._0_4_ = auVar60._0_4_ * auVar28._0_4_;
            auVar44._4_4_ = auVar60._4_4_ * auVar28._4_4_;
            auVar44._8_4_ = auVar60._8_4_ * auVar28._8_4_;
            auVar44._12_4_ = auVar60._12_4_ * auVar28._12_4_;
            uVar22 = *(undefined4 *)(uVar17 + 0x60 + lVar5 * 4);
            auVar48._4_4_ = uVar22;
            auVar48._0_4_ = uVar22;
            auVar48._8_4_ = uVar22;
            auVar48._12_4_ = uVar22;
            auVar28 = vsubps_avx(auVar48,auVar61._0_16_);
            auVar49._0_4_ = auVar64._0_4_ * auVar28._0_4_;
            auVar49._4_4_ = auVar64._4_4_ * auVar28._4_4_;
            auVar49._8_4_ = auVar64._8_4_ * auVar28._8_4_;
            auVar49._12_4_ = auVar64._12_4_ * auVar28._12_4_;
            uVar22 = *(undefined4 *)(uVar17 + 0xa0 + lVar5 * 4);
            auVar52._4_4_ = uVar22;
            auVar52._0_4_ = uVar22;
            auVar52._8_4_ = uVar22;
            auVar52._12_4_ = uVar22;
            auVar28 = vsubps_avx(auVar52,auVar62._0_16_);
            auVar53._0_4_ = auVar65._0_4_ * auVar28._0_4_;
            auVar53._4_4_ = auVar65._4_4_ * auVar28._4_4_;
            auVar53._8_4_ = auVar65._8_4_ * auVar28._8_4_;
            auVar53._12_4_ = auVar65._12_4_ * auVar28._12_4_;
            uVar22 = *(undefined4 *)(uVar17 + 0xe0 + lVar5 * 4);
            auVar55._4_4_ = uVar22;
            auVar55._0_4_ = uVar22;
            auVar55._8_4_ = uVar22;
            auVar55._12_4_ = uVar22;
            auVar28 = vsubps_avx(auVar55,auVar63._0_16_);
            auVar56._0_4_ = auVar60._0_4_ * auVar28._0_4_;
            auVar56._4_4_ = auVar60._4_4_ * auVar28._4_4_;
            auVar56._8_4_ = auVar60._8_4_ * auVar28._8_4_;
            auVar56._12_4_ = auVar60._12_4_ * auVar28._12_4_;
            auVar28 = vpminsd_avx(auVar34,auVar49);
            auVar29 = vpminsd_avx(auVar38,auVar53);
            auVar28 = vpmaxsd_avx(auVar28,auVar29);
            auVar37 = vpminsd_avx(auVar44,auVar56);
            auVar29 = vpmaxsd_avx(auVar34,auVar49);
            auVar33 = vpmaxsd_avx(auVar38,auVar53);
            auVar47 = vpminsd_avx(auVar29,auVar33);
            auVar29 = vpmaxsd_avx(auVar44,auVar56);
            auVar33 = vpmaxsd_avx(auVar37,local_2550);
            auVar28 = vpmaxsd_avx(auVar28,auVar33);
            auVar29 = vpminsd_avx(auVar29,local_26d0);
            auVar29 = vpminsd_avx(auVar47,auVar29);
            auVar28 = vcmpps_avx(auVar28,auVar29,2);
            uVar19 = uVar18;
            if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar28[0xf] < '\0') {
              uVar22 = *(undefined4 *)((long)&local_2660.valid + lVar5 * 4);
              auVar35._4_4_ = uVar22;
              auVar35._0_4_ = uVar22;
              auVar35._8_4_ = uVar22;
              auVar35._12_4_ = uVar22;
              uVar19 = *(ulong *)(uVar17 + lVar5 * 8);
              auVar29 = auVar32._0_16_;
              auVar28 = vcmpps_avx(auVar35,auVar29,1);
              if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar28[0xf]) {
                *puVar21 = uVar19;
                uVar19 = uVar18;
              }
              else {
                if (uVar18 == 8) {
                  auVar32 = ZEXT1664(auVar35);
                  goto LAB_0100ace7;
                }
                *puVar21 = uVar18;
                auVar32 = ZEXT1664(auVar35);
                auVar35 = auVar29;
              }
              uVar24 = uVar24 + 1;
              *(int *)(puVar21 + 1) = auVar35._0_4_;
              puVar21 = puVar21 + 2;
            }
LAB_0100ace7:
            uVar23 = uVar23 & uVar23 - 1;
            uVar18 = uVar19;
          } while (uVar23 != 0);
          if (uVar19 == 8) goto LAB_0100aa45;
          uVar17 = uVar19;
          if (1 < uVar24) {
            puVar1 = puVar21 + -4;
            puVar2 = puVar21 + -2;
            if ((uint)puVar21[-3] < (uint)puVar21[-1]) {
              uVar18 = *puVar1;
              uVar23 = puVar21[-3];
              *(int *)(puVar21 + -3) = (int)puVar21[-1];
              *puVar1 = *puVar2;
              *puVar2 = uVar18;
              local_26e0._8_4_ = (undefined4)uVar23;
              *(undefined4 *)(puVar21 + -1) = local_26e0._8_4_;
            }
            if (uVar24 != 2) {
              puVar3 = puVar21 + -6;
              uVar16 = (uint)puVar21[-5];
              if (uVar16 < (uint)puVar21[-1]) {
                uVar18 = *puVar3;
                uVar23 = puVar21[-5];
                *(int *)(puVar21 + -5) = (int)puVar21[-1];
                *puVar3 = *puVar2;
                *puVar2 = uVar18;
                local_26e0._8_4_ = (undefined4)uVar23;
                *(undefined4 *)(puVar21 + -1) = local_26e0._8_4_;
                uVar16 = (uint)puVar21[-5];
              }
              if (uVar16 < (uint)puVar21[-3]) {
                uVar18 = *puVar3;
                uVar23 = puVar21[-5];
                *(int *)(puVar21 + -5) = (int)puVar21[-3];
                *puVar3 = *puVar1;
                *puVar1 = uVar18;
                local_26e0._8_4_ = (undefined4)uVar23;
                *(undefined4 *)(puVar21 + -3) = local_26e0._8_4_;
              }
            }
          }
        }
        local_2560 = vcmpps_avx(local_26d0,auVar32._0_16_,6);
        auVar32 = ZEXT1664(local_2560);
      } while ((((local_2560 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                (local_2560 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (local_2560 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               -1 < local_2560[0xf]);
      local_2690 = (ulong)((uint)uVar17 & 0xf) - 8;
      for (local_2688 = 0; auVar28 = auVar32._0_16_, local_2690 != local_2688;
          local_2688 = local_2688 + 1) {
        local_2660.geomID = *(uint *)((uVar17 & 0xfffffffffffffff0) + local_2688 * 8);
        local_2630 = (context->scene->geometries).items[local_2660.geomID].ptr;
        uVar16 = local_2630->mask;
        auVar30._4_4_ = uVar16;
        auVar30._0_4_ = uVar16;
        auVar30._8_4_ = uVar16;
        auVar30._12_4_ = uVar16;
        auVar29 = vandps_avx(auVar30,*(undefined1 (*) [16])(ray + 0x90));
        auVar29 = vpcmpeqd_avx(auVar29,_DAT_01f45a50);
        auVar33 = auVar28 & ~auVar29;
        if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar33[0xf] < '\0') {
          local_26e0 = vandnps_avx(auVar29,auVar28);
          local_2660.geometryUserPtr = local_2630->userPtr;
          local_2660.valid = (int *)local_26e0;
          auVar28 = (undefined1  [16])local_2660._0_16_;
          local_2660.context = context->user;
          local_2660.N = 4;
          local_2660.primID = *(undefined4 *)((uVar17 & 0xfffffffffffffff0) + 4 + local_2688 * 8);
          local_2660._0_20_ = CONCAT416(local_2660.primID,auVar28);
          local_2628 = 0;
          local_2620 = context->args;
          pp_Var20 = (_func_int **)local_2620->intersect;
          if (pp_Var20 == (_func_int **)0x0) {
            pp_Var20 = local_2630[1].super_RefCount._vptr_RefCount;
          }
          local_2660.rayhit = (RTCRayHitN *)ray;
          (*(code *)pp_Var20)(&local_2660);
          auVar61 = ZEXT1664(local_2570);
          auVar62 = ZEXT1664(local_2580);
          auVar63 = ZEXT1664(local_2590);
          auVar64 = ZEXT1664(local_25a0);
          auVar65 = ZEXT1664(local_25b0);
          auVar60 = ZEXT1664(local_25c0);
          auVar58 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar32 = ZEXT1664(local_2560);
          context = local_26a0;
          ray = local_26a8;
          uVar25 = local_2698;
        }
      }
      auVar29 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),local_26d0,1);
      auVar29 = auVar28 & auVar29;
    } while ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar29[0xf]);
    local_26d0 = vblendvps_avx(local_26d0,*(undefined1 (*) [16])(ray + 0x80),auVar28);
    auVar28 = vshufps_avx(local_26d0,local_26d0,0xb1);
    auVar28 = vmaxps_avx(auVar28,local_26d0);
    auVar29 = vshufpd_avx(auVar28,auVar28,1);
    auVar47 = vmaxss_avx(auVar29,auVar28);
  } while( true );
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }